

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,unsigned_int>::
    KeyCompare<char_const*>(void *ap,void *bp)

{
  int iVar1;
  uint8_t *offset_location;
  ulong uVar2;
  ulong uVar3;
  uint8_t *data;
  char **key;
  
  uVar3 = (ulong)*bp;
  if (*(ushort *)((long)bp + (uVar3 - (long)*(int *)((long)bp + uVar3))) < 0xb) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)*(ushort *)((long)bp + ((uVar3 + 10) - (long)*(int *)((long)bp + uVar3)));
  }
  iVar1 = strcmp((char *)((long)bp + (ulong)*(uint *)((long)bp + uVar2 + uVar3) + uVar2 + uVar3 + 4)
                 ,*ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }